

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::Context::~Context(Context *this)

{
  ContextState *this_00;
  
  this_00 = this->p;
  if (detail::g_cs == this_00) {
    detail::g_cs = (ContextState *)0x0;
    this_00 = this->p;
  }
  if (this_00 != (ContextState *)0x0) {
    detail::ContextState::~ContextState(this_00);
  }
  operator_delete(this_00,0x1160);
  return;
}

Assistant:

Context::~Context() {
    if(g_cs == p)
        g_cs = nullptr;
    delete p;
}